

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitFancyRGB(VP8Io *io,WebPDecParams *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  WebPUpsampleLinePairFunc p_Var5;
  uint uVar6;
  int iVar7;
  long *in_RSI;
  long in_RDI;
  int uv_w;
  int mb_w;
  int y_end;
  int y;
  uint8_t *top_v;
  uint8_t *top_u;
  uint8_t *cur_v;
  uint8_t *cur_u;
  uint8_t *cur_y;
  WebPUpsampleLinePairFunc upsample;
  uint8_t *dst;
  WebPRGBABuffer *buf;
  int num_lines_out;
  int local_64;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_30;
  int local_1c;
  
  local_1c = *(int *)(in_RDI + 0x10);
  lVar4 = *in_RSI;
  local_30 = (uint8_t *)
             (*(long *)(lVar4 + 0x10) + (long)*(int *)(in_RDI + 8) * (long)*(int *)(lVar4 + 0x18));
  p_Var5 = WebPUpsamplers[*(uint *)*in_RSI];
  local_40 = *(uint8_t **)(in_RDI + 0x18);
  local_48 = *(uint8_t **)(in_RDI + 0x20);
  local_50 = *(uint8_t **)(in_RDI + 0x28);
  local_64 = *(int *)(in_RDI + 8);
  uVar6 = *(int *)(in_RDI + 8) + *(int *)(in_RDI + 0x10);
  iVar1 = *(int *)(in_RDI + 0xc);
  iVar7 = (iVar1 + 1) / 2;
  if (local_64 == 0) {
    (*p_Var5)(local_40,(uint8_t *)0x0,local_48,local_50,local_48,local_50,local_30,(uint8_t *)0x0,
              iVar1);
  }
  else {
    (*p_Var5)((uint8_t *)in_RSI[1],local_40,(uint8_t *)in_RSI[2],(uint8_t *)in_RSI[3],local_48,
              local_50,local_30 + -(long)*(int *)(lVar4 + 0x18),local_30,iVar1);
    local_1c = local_1c + 1;
  }
  for (; local_64 + 2 < (int)uVar6; local_64 = local_64 + 2) {
    iVar2 = *(int *)(in_RDI + 0x34);
    iVar3 = *(int *)(in_RDI + 0x34);
    local_30 = local_30 + (*(int *)(lVar4 + 0x18) << 1);
    local_40 = local_40 + (*(int *)(in_RDI + 0x30) << 1);
    (*p_Var5)(local_40 + -(long)*(int *)(in_RDI + 0x30),local_40,local_48,local_50,local_48 + iVar2,
              local_50 + iVar3,local_30 + -(long)*(int *)(lVar4 + 0x18),local_30,iVar1);
    local_50 = local_50 + iVar3;
    local_48 = local_48 + iVar2;
  }
  if ((int)(*(int *)(in_RDI + 0x80) + uVar6) < *(int *)(in_RDI + 0x84)) {
    memcpy((void *)in_RSI[1],local_40 + *(int *)(in_RDI + 0x30),(long)iVar1);
    memcpy((void *)in_RSI[2],local_48,(long)iVar7);
    memcpy((void *)in_RSI[3],local_50,(long)iVar7);
    local_1c = local_1c + -1;
  }
  else if ((uVar6 & 1) == 0) {
    (*p_Var5)(local_40 + *(int *)(in_RDI + 0x30),(uint8_t *)0x0,local_48,local_50,local_48,local_50,
              local_30 + *(int *)(lVar4 + 0x18),(uint8_t *)0x0,iVar1);
  }
  return local_1c;
}

Assistant:

static int EmitFancyRGB(const VP8Io* const io, WebPDecParams* const p) {
  int num_lines_out = io->mb_h;   // a priori guess
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* dst = buf->rgba + (ptrdiff_t)io->mb_y * buf->stride;
  WebPUpsampleLinePairFunc upsample = WebPUpsamplers[p->output->colorspace];
  const uint8_t* cur_y = io->y;
  const uint8_t* cur_u = io->u;
  const uint8_t* cur_v = io->v;
  const uint8_t* top_u = p->tmp_u;
  const uint8_t* top_v = p->tmp_v;
  int y = io->mb_y;
  const int y_end = io->mb_y + io->mb_h;
  const int mb_w = io->mb_w;
  const int uv_w = (mb_w + 1) / 2;

  if (y == 0) {
    // First line is special cased. We mirror the u/v samples at boundary.
    upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v, dst, NULL, mb_w);
  } else {
    // We can finish the left-over line from previous call.
    upsample(p->tmp_y, cur_y, top_u, top_v, cur_u, cur_v,
             dst - buf->stride, dst, mb_w);
    ++num_lines_out;
  }
  // Loop over each output pairs of row.
  for (; y + 2 < y_end; y += 2) {
    top_u = cur_u;
    top_v = cur_v;
    cur_u += io->uv_stride;
    cur_v += io->uv_stride;
    dst += 2 * buf->stride;
    cur_y += 2 * io->y_stride;
    upsample(cur_y - io->y_stride, cur_y,
             top_u, top_v, cur_u, cur_v,
             dst - buf->stride, dst, mb_w);
  }
  // move to last row
  cur_y += io->y_stride;
  if (io->crop_top + y_end < io->crop_bottom) {
    // Save the unfinished samples for next call (as we're not done yet).
    memcpy(p->tmp_y, cur_y, mb_w * sizeof(*p->tmp_y));
    memcpy(p->tmp_u, cur_u, uv_w * sizeof(*p->tmp_u));
    memcpy(p->tmp_v, cur_v, uv_w * sizeof(*p->tmp_v));
    // The fancy upsampler leaves a row unfinished behind
    // (except for the very last row)
    num_lines_out--;
  } else {
    // Process the very last row of even-sized picture
    if (!(y_end & 1)) {
      upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v,
               dst + buf->stride, NULL, mb_w);
    }
  }
  return num_lines_out;
}